

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar1;
  bool bVar2;
  MethodOptions *pMVar3;
  string *psVar4;
  string *psVar5;
  Symbol SVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  Symbol output_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  Symbol input_type;
  MethodDescriptorProto *proto_local;
  MethodDescriptor *method_local;
  DescriptorBuilder *this_local;
  
  input_type.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)proto;
  if (*(long *)(method + 0x28) == 0) {
    pMVar3 = MethodOptions::default_instance();
    *(MethodOptions **)(method + 0x28) = pMVar3;
  }
  psVar4 = MethodDescriptorProto::input_type_abi_cxx11_
                     ((MethodDescriptorProto *)input_type.field_1.descriptor);
  psVar5 = MethodDescriptor::full_name_abi_cxx11_(method);
  SVar6 = LookupSymbol(this,psVar4,psVar5,PLACEHOLDER_MESSAGE,LOOKUP_ALL);
  input_type._0_8_ = SVar6.field_1;
  local_30._0_4_ = SVar6.type;
  bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_30);
  if (bVar2) {
    psVar4 = MethodDescriptor::full_name_abi_cxx11_(method);
    aVar1 = input_type.field_1;
    psVar5 = MethodDescriptorProto::input_type_abi_cxx11_
                       ((MethodDescriptorProto *)input_type.field_1.descriptor);
    AddNotDefinedError(this,psVar4,(Message *)aVar1.descriptor,INPUT_TYPE,psVar5);
  }
  else if (local_30._0_4_ == MESSAGE) {
    *(undefined8 *)(method + 0x18) = input_type._0_8_;
  }
  else {
    psVar4 = MethodDescriptor::full_name_abi_cxx11_(method);
    aVar1 = input_type.field_1;
    psVar5 = MethodDescriptorProto::input_type_abi_cxx11_
                       ((MethodDescriptorProto *)input_type.field_1.descriptor);
    std::operator+(&local_70,"\"",psVar5);
    std::operator+(&local_50,&local_70,"\" is not a message type.");
    AddError(this,psVar4,(Message *)aVar1.descriptor,INPUT_TYPE,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  psVar4 = MethodDescriptorProto::output_type_abi_cxx11_
                     ((MethodDescriptorProto *)input_type.field_1.descriptor);
  psVar5 = MethodDescriptor::full_name_abi_cxx11_(method);
  SVar6 = LookupSymbol(this,psVar4,psVar5,PLACEHOLDER_MESSAGE,LOOKUP_ALL);
  output_type._0_8_ = SVar6.field_1;
  local_90._0_4_ = SVar6.type;
  bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_90);
  if (bVar2) {
    psVar4 = MethodDescriptor::full_name_abi_cxx11_(method);
    aVar1 = input_type.field_1;
    psVar5 = MethodDescriptorProto::output_type_abi_cxx11_
                       ((MethodDescriptorProto *)input_type.field_1.descriptor);
    AddNotDefinedError(this,psVar4,(Message *)aVar1.descriptor,OUTPUT_TYPE,psVar5);
  }
  else if (local_90._0_4_ == MESSAGE) {
    *(undefined8 *)(method + 0x20) = output_type._0_8_;
  }
  else {
    psVar4 = MethodDescriptor::full_name_abi_cxx11_(method);
    aVar1 = input_type.field_1;
    psVar5 = MethodDescriptorProto::output_type_abi_cxx11_
                       ((MethodDescriptorProto *)input_type.field_1.descriptor);
    std::operator+(&local_d0,"\"",psVar5);
    std::operator+(&local_b0,&local_d0,"\" is not a message type.");
    AddError(this,psVar4,(Message *)aVar1.descriptor,OUTPUT_TYPE,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(
    MethodDescriptor* method, const MethodDescriptorProto& proto) {
  if (method->options_ == NULL) {
    method->options_ = &MethodOptions::default_instance();
  }

  Symbol input_type = LookupSymbol(proto.input_type(), method->full_name());
  if (input_type.IsNull()) {
    AddNotDefinedError(method->full_name(), proto,
                       DescriptorPool::ErrorCollector::INPUT_TYPE,
                       proto.input_type());
  } else if (input_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE,
             "\"" + proto.input_type() + "\" is not a message type.");
  } else {
    method->input_type_ = input_type.descriptor;
  }

  Symbol output_type = LookupSymbol(proto.output_type(), method->full_name());
  if (output_type.IsNull()) {
    AddNotDefinedError(method->full_name(), proto,
                       DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                       proto.output_type());
  } else if (output_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE,
             "\"" + proto.output_type() + "\" is not a message type.");
  } else {
    method->output_type_ = output_type.descriptor;
  }
}